

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

DdNode * Cudd_addNewVar(DdManager *dd)

{
  DdNode *pDVar1;
  
  if ((uint)dd->size < 0x7ffffffe) {
    do {
      dd->reordered = 0;
      pDVar1 = cuddUniqueInter(dd,dd->size,dd->one,dd->zero);
    } while (dd->reordered == 1);
    return pDVar1;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addNewVar(
  DdManager * dd)
{
    DdNode *res;

    if ((unsigned int) dd->size >= CUDD_MAXINDEX - 1) return(NULL);
    do {
        dd->reordered = 0;
        res = cuddUniqueInter(dd,dd->size,DD_ONE(dd),DD_ZERO(dd));
    } while (dd->reordered == 1);

    return(res);

}